

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O2

void anon_unknown.dwarf_270a50::writeReadRGBA
               (char *fileName,int width,int height,Array2D<Imf_3_2::Rgba> *p1,RgbaChannels channels
               ,Compression comp)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  Box<Imath_3_2::Vec2<int>_> *pBVar6;
  Box<Imath_3_2::Vec2<int>_> *pBVar7;
  float *pfVar8;
  half *phVar9;
  long lVar10;
  undefined4 in_register_00000034;
  Array2D<Imf_3_2::Rgba> *src;
  char *pcVar11;
  half *phVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  RgbaOutputFile out;
  half hStack_106;
  half hStack_104;
  half hStack_102;
  Array2D<Imf_3_2::Rgba> p2;
  WriterThread writer1;
  int local_90;
  Header header;
  WriterThread writer2;
  
  src = (Array2D<Imf_3_2::Rgba> *)CONCAT44(in_register_00000034,width);
  poVar4 = std::operator<<((ostream *)&std::cout,"channels ");
  pcVar11 = "R";
  if ((height & 1U) == 0) {
    pcVar11 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar11);
  pcVar11 = "G";
  if ((height & 2U) == 0) {
    pcVar11 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar11);
  pcVar11 = "B";
  if ((height & 4U) == 0) {
    pcVar11 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar11);
  pcVar11 = "A";
  if ((height & 8U) == 0) {
    pcVar11 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar11);
  poVar4 = std::operator<<(poVar4,", compression ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)p1);
  std::operator<<(poVar4,", ");
  std::ostream::flush();
  _out = 0;
  hStack_106._h = 0;
  hStack_104._h = 0;
  hStack_102._h = 0;
  Imf_3_2::Header::Header(&header,0x55b,0x9f,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  piVar5 = (int *)Imf_3_2::Header::compression();
  *piVar5 = (int)p1;
  remove(fileName);
  std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::flush();
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile(&out,fileName,&header,height,iVar3);
  Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)src->_data,1);
  (anonymous_namespace)::remainingScanlines = 0x9f;
  WriterThread::WriterThread(&writer1,&out);
  WriterThread::WriterThread(&writer2,&out);
  IlmThread_3_2::Semaphore::wait();
  IlmThread_3_2::Semaphore::wait();
  IlmThread_3_2::Thread::~Thread(&writer2.super_Thread);
  IlmThread_3_2::Thread::~Thread(&writer1.super_Thread);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
  std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::flush();
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,fileName,iVar3);
  piVar5 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  iVar3 = *piVar5;
  lVar10 = (long)piVar5[2] - (long)iVar3;
  lVar13 = lVar10 + 1;
  iVar1 = piVar5[1];
  lVar14 = (long)piVar5[3] - (long)iVar1;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(&p2,lVar14 + 1,lVar13);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            ((Rgba *)&out,(ulong)(p2._data + (-(long)iVar1 * p2._sizeY - (long)iVar3)),1);
  iVar3 = (int)lVar13;
  ReaderThread::ReaderThread((ReaderThread *)&writer1,(RgbaInputFile *)&out,0,iVar3);
  ReaderThread::ReaderThread((ReaderThread *)&writer2,(RgbaInputFile *)&out,1,iVar3);
  IlmThread_3_2::Semaphore::wait();
  IlmThread_3_2::Semaphore::wait();
  IlmThread_3_2::Thread::~Thread(&writer2.super_Thread);
  IlmThread_3_2::Thread::~Thread(&writer1.super_Thread);
  pBVar6 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::RgbaInputFile::displayWindow();
  pBVar7 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar6,pBVar7);
  if (!bVar2) {
    __assert_fail("in.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,199,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  pBVar6 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::RgbaInputFile::dataWindow();
  pBVar7 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar6,pBVar7);
  if (!bVar2) {
    __assert_fail("in.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,200,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  fVar15 = (float)Imf_3_2::RgbaInputFile::pixelAspectRatio();
  pfVar8 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar15 == *pfVar8) && (!NAN(fVar15) && !NAN(*pfVar8))) {
    Imf_3_2::RgbaInputFile::screenWindowCenter();
    pfVar8 = (float *)Imf_3_2::Header::screenWindowCenter();
    if (((((float)writer1._0_4_ != *pfVar8) || (NAN((float)writer1._0_4_) || NAN(*pfVar8))) ||
        ((float)writer1._4_4_ != pfVar8[1])) || (NAN((float)writer1._4_4_) || NAN(pfVar8[1]))) {
      __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                    ,0xca,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                   );
    }
    fVar15 = (float)Imf_3_2::RgbaInputFile::screenWindowWidth();
    pfVar8 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar15 != *pfVar8) || (NAN(fVar15) || NAN(*pfVar8))) {
      __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                    ,0xcb,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                   );
    }
    iVar3 = Imf_3_2::RgbaInputFile::lineOrder();
    piVar5 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar3 != *piVar5) {
      __assert_fail("in.lineOrder () == header.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                    ,0xcc,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                   );
    }
    iVar3 = Imf_3_2::RgbaInputFile::compression();
    piVar5 = (int *)Imf_3_2::Header::compression();
    if (iVar3 == *piVar5) {
      iVar3 = Imf_3_2::RgbaInputFile::channels();
      if (iVar3 != height) {
        __assert_fail("in.channels () == channels",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                      ,0xce,
                      "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                     );
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"comparing ");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar3 = Imf_3_2::RgbaInputFile::compression();
      if ((iVar3 == 6) || (iVar3 = Imf_3_2::RgbaInputFile::compression(), iVar3 == 7)) {
        compareB44(0x55b,0x9f,src,&p2,height);
      }
      else {
        iVar3 = Imf_3_2::RgbaInputFile::compression();
        if ((iVar3 == 8) || (iVar3 = Imf_3_2::RgbaInputFile::compression(), iVar3 == 9)) {
          compareDwa(0x55b,0x9f,src,&p2,height);
        }
        else {
          local_90 = (int)lVar10;
          phVar12 = &src->_data->a;
          phVar9 = &(p2._data)->a;
          for (lVar13 = 0; lVar13 <= (int)lVar14; lVar13 = lVar13 + 1) {
            for (lVar10 = 0; lVar10 <= local_90; lVar10 = lVar10 + 1) {
              fVar15 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar10 * 4 + -3]._h * 4
                                 );
              if ((height & 1U) == 0) {
                if ((fVar15 != 0.0) || (NAN(fVar15))) {
                  __assert_fail("p2[y][x].r == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                ,0xe6,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                               );
                }
              }
              else {
                pfVar8 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar12[lVar10 * 4 + -3]._h * 4);
                if ((fVar15 != *pfVar8) || (NAN(fVar15) || NAN(*pfVar8))) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                ,0xe4,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                               );
                }
              }
              fVar15 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar10 * 4 + -2]._h * 4
                                 );
              if ((height & 2U) == 0) {
                if ((fVar15 != 0.0) || (NAN(fVar15))) {
                  __assert_fail("p2[y][x].g == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                ,0xeb,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                               );
                }
              }
              else {
                pfVar8 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar12[lVar10 * 4 + -2]._h * 4);
                if ((fVar15 != *pfVar8) || (NAN(fVar15) || NAN(*pfVar8))) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                ,0xe9,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                               );
                }
              }
              fVar15 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar10 * 4 + -1]._h * 4
                                 );
              if ((height & 4U) == 0) {
                if ((fVar15 != 0.0) || (NAN(fVar15))) {
                  __assert_fail("p2[y][x].b == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                ,0xf0,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                               );
                }
              }
              else {
                pfVar8 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar12[lVar10 * 4 + -1]._h * 4);
                if ((fVar15 != *pfVar8) || (NAN(fVar15) || NAN(*pfVar8))) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                ,0xee,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                               );
                }
              }
              fVar15 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar10 * 4]._h * 4);
              if ((height & 8U) == 0) {
                if ((fVar15 != 1.0) || (NAN(fVar15))) {
                  __assert_fail("p2[y][x].a == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                ,0xf5,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                               );
                }
              }
              else {
                pfVar8 = (float *)(_imath_half_to_float_table + (ulong)phVar12[lVar10 * 4]._h * 4);
                if ((fVar15 != *pfVar8) || (NAN(fVar15) || NAN(*pfVar8))) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                ,0xf3,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                               );
                }
              }
            }
            phVar12 = phVar12 + src->_sizeY * 4;
            phVar9 = phVar9 + p2._sizeY * 4;
          }
        }
      }
      Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&p2);
      Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
      remove(fileName);
      Imf_3_2::Header::~Header(&header);
      return;
    }
    __assert_fail("in.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,0xcd,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                ,0xc9,
                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
               );
}

Assistant:

void
writeReadRGBA (
    const char           fileName[],
    int                  width,
    int                  height,
    const Array2D<Rgba>& p1,
    RgbaChannels         channels,
    Compression          comp)
{
    //
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the original.
    //

    cout << "channels " << ((channels & WRITE_R) ? "R" : "")
         << ((channels & WRITE_G) ? "G" : "")
         << ((channels & WRITE_B) ? "B" : "")
         << ((channels & WRITE_A) ? "A" : "") << ", compression " << comp
         << ", " << flush;

    Header header (width, height);
    header.compression () = comp;

    {
        remove (fileName);
        cout << "writing " << flush;
        RgbaOutputFile out (fileName, header, channels);
        out.setFrameBuffer (&p1[0][0], 1, width);

        remainingScanlines = height;
        WriterThread writer1 (&out);
        WriterThread writer2 (&out);
        threadSemaphore.wait ();
        threadSemaphore.wait ();
    }

    {
        cout << "reading " << flush;
        RgbaInputFile in (fileName);
        const Box2i&  dw = in.dataWindow ();

        int w  = dw.max.x - dw.min.x + 1;
        int h  = dw.max.y - dw.min.y + 1;
        int dx = dw.min.x;
        int dy = dw.min.y;

        Array2D<Rgba> p2 (h, w);
        in.setFrameBuffer (&p2[-dy][-dx], 1, w);

        {
            ReaderThread reader1 (&in, 0, 2);
            ReaderThread reader2 (&in, 1, 2);
            threadSemaphore.wait ();
            threadSemaphore.wait ();
        }

        assert (in.displayWindow () == header.displayWindow ());
        assert (in.dataWindow () == header.dataWindow ());
        assert (in.pixelAspectRatio () == header.pixelAspectRatio ());
        assert (in.screenWindowCenter () == header.screenWindowCenter ());
        assert (in.screenWindowWidth () == header.screenWindowWidth ());
        assert (in.lineOrder () == header.lineOrder ());
        assert (in.compression () == header.compression ());
        assert (in.channels () == channels);

        cout << "comparing " << endl;

        if (in.compression () == B44_COMPRESSION ||
            in.compression () == B44A_COMPRESSION)
        {
            compareB44 (width, height, p1, p2, channels);
        }
        else if (
            in.compression () == DWAA_COMPRESSION ||
            in.compression () == DWAB_COMPRESSION)
        {
            compareDwa (width, height, p1, p2, channels);
        }
        else
        {
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {
                    if (channels & WRITE_R)
                        assert (p2[y][x].r == p1[y][x].r);
                    else
                        assert (p2[y][x].r == 0);

                    if (channels & WRITE_G)
                        assert (p2[y][x].g == p1[y][x].g);
                    else
                        assert (p2[y][x].g == 0);

                    if (channels & WRITE_B)
                        assert (p2[y][x].b == p1[y][x].b);
                    else
                        assert (p2[y][x].b == 0);

                    if (channels & WRITE_A)
                        assert (p2[y][x].a == p1[y][x].a);
                    else
                        assert (p2[y][x].a == 1);
                }
            }
        }
    }

    remove (fileName);
}